

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPSegment.hpp
# Opt level: O2

bool __thiscall cppjieba::MPSegment::IsUserDictSingleChineseWord(MPSegment *this,Rune *value)

{
  bool bVar1;
  
  bVar1 = std::
          IsIn<unsigned_int,std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>
                    (&this->dictTrie_->user_dict_single_chinese_word_,value);
  return bVar1;
}

Assistant:

bool IsUserDictSingleChineseWord(const Rune& value) const {
    return dictTrie_->IsUserDictSingleChineseWord(value);
  }